

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execClr<(moira::Instr)36,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  
  addr = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7);
  readM<(moira::MemSpace)1,(moira::Size)1,128ul>(this,addr);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,0);
  (this->reg).sr.n = false;
  (this->reg).sr.z = true;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return;
}

Assistant:

void
Moira::execClr(u16 opcode)
{
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(2);
    writeOp <M,S, REVERSE | POLLIPL> (dst, ea, 0);

    reg.sr.n = 0;
    reg.sr.z = 1;
    reg.sr.v = 0;
    reg.sr.c = 0;
}